

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
duckdb_re2::NamedCapturesWalker::PreVisit
          (NamedCapturesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  RegexpOp RVar1;
  string *psVar2;
  void *pvVar3;
  Ignored in_EDX;
  Regexp *in_RSI;
  long in_RDI;
  int *__y;
  value_type *__x;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  value_type local_48;
  Ignored local_14;
  Regexp *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  RVar1 = Regexp::op(in_RSI);
  if (RVar1 == kRegexpCapture) {
    psVar2 = Regexp::name_abi_cxx11_(local_10);
    if (psVar2 != (string *)0x0) {
      if (*(long *)(in_RDI + 0x60) == 0) {
        pvVar3 = operator_new(0x30);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)0x813213);
        *(void **)(in_RDI + 0x60) = pvVar3;
      }
      __y = *(int **)(in_RDI + 0x60);
      Regexp::name_abi_cxx11_(local_10);
      Regexp::cap(local_10);
      __x = &local_48;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::pair<int,_true>((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                         *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),&__x->first
                        ,__y);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),__x);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
               *)0x81329f);
    }
  }
  return local_14;
}

Assistant:

virtual Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new std::map<std::string, int>;

      // Record first occurrence of each name.
      // (The rule is that if you have the same name
      // multiple times, only the leftmost one counts.)
      map_->insert({*re->name(), re->cap()});
    }
    return ignored;
  }